

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::Quantize_x86_avx::forward(Quantize_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  long in_RCX;
  float *in_RDX;
  long *in_RSI;
  long in_RDI;
  bool bVar2;
  Mat scale_data_q_1;
  char *s8ptr_2;
  float *ptr_4;
  int q_1;
  Mat scale_data_q;
  char *s8ptr3_1;
  char *s8ptr2_1;
  char *s8ptr1_1;
  char *s8ptr0_1;
  float *ptr_3;
  int q;
  size_t out_elemsize_2;
  int outc;
  int out_elempack_2;
  Mat scale_data_i_1;
  char *s8ptr_1;
  float *ptr_2;
  int i_2;
  Mat scale_data_i;
  char *s8ptr3;
  char *s8ptr2;
  char *s8ptr1;
  char *s8ptr0;
  float *ptr_1;
  int i_1;
  size_t out_elemsize_1;
  int outh;
  int out_elempack_1;
  int size;
  char *s8ptr;
  float *ptr;
  int i;
  int ii;
  int nn_w;
  int wp;
  size_t out_elemsize;
  int outw;
  int out_elempack;
  int elempack;
  int channels;
  int h;
  int w;
  int dims;
  Mat *m_5;
  Mat *m;
  Mat *m_6;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Allocator *in_stack_fffffffffffff100;
  void **ppvVar3;
  size_t in_stack_fffffffffffff108;
  size_t in_stack_fffffffffffff110;
  undefined8 in_stack_fffffffffffff118;
  Mat *in_stack_fffffffffffff120;
  Allocator *in_stack_fffffffffffff180;
  Mat *in_stack_fffffffffffff1b8;
  char *in_stack_fffffffffffff1c0;
  char *in_stack_fffffffffffff1c8;
  char *in_stack_fffffffffffff1d0;
  char *in_stack_fffffffffffff1d8;
  float *in_stack_fffffffffffff1e0;
  long in_stack_fffffffffffff1f0;
  Mat *in_stack_fffffffffffff1f8;
  char *in_stack_fffffffffffff200;
  float *in_stack_fffffffffffff208;
  void *local_d18;
  int *local_d10;
  undefined8 local_d08;
  undefined4 local_d00;
  long *local_cf8;
  undefined4 local_cf0;
  uint local_cec;
  undefined4 local_ce8;
  undefined4 local_ce4;
  undefined4 local_ce0;
  long local_cd8;
  undefined8 local_cd0;
  undefined8 local_cc8;
  undefined8 local_cc0;
  undefined4 local_cb8;
  long local_cb0;
  undefined4 local_ca8;
  undefined4 local_ca4;
  undefined4 local_ca0;
  undefined4 local_c9c;
  undefined4 local_c98;
  undefined8 local_c90;
  long local_c88;
  undefined8 local_c80;
  undefined8 local_c78;
  undefined8 local_c70;
  undefined4 local_c68;
  long local_c60;
  undefined4 local_c58;
  undefined4 local_c54;
  undefined4 local_c50;
  undefined4 local_c4c;
  undefined4 local_c48;
  undefined8 local_c40;
  long local_c38;
  int local_c2c;
  void *local_c28;
  int *local_c20;
  undefined8 local_c18;
  undefined4 local_c10;
  long *local_c08;
  undefined4 local_c00;
  uint local_bfc;
  undefined4 local_bf8;
  undefined4 local_bf4;
  undefined4 local_bf0;
  long local_be8;
  undefined8 local_be0;
  undefined8 local_bd8;
  undefined8 local_bd0;
  undefined4 local_bc8;
  undefined8 local_bc0;
  undefined4 local_bb8;
  undefined4 local_bb4;
  undefined4 local_bb0;
  undefined4 local_bac;
  undefined4 local_ba8;
  undefined8 local_ba0;
  long local_b98;
  char local_b90 [32];
  undefined8 local_b70;
  undefined4 local_b68;
  undefined4 local_b64;
  undefined4 local_b60;
  undefined4 local_b5c;
  undefined4 local_b58;
  undefined8 local_b50;
  char *local_b48;
  char local_b40 [32];
  undefined8 local_b20;
  undefined4 local_b18;
  undefined4 local_b14;
  undefined4 local_b10;
  undefined4 local_b0c;
  undefined4 local_b08;
  undefined8 local_b00;
  long local_af8;
  undefined8 local_af0;
  undefined8 local_ae8;
  undefined8 local_ae0;
  undefined4 local_ad8;
  undefined8 local_ad0;
  undefined4 local_ac8;
  undefined4 local_ac4;
  undefined4 local_ac0;
  undefined4 local_abc;
  undefined4 local_ab8;
  undefined8 local_ab0;
  long local_aa8;
  undefined8 local_aa0;
  undefined8 local_a98;
  undefined8 local_a90;
  undefined4 local_a88;
  long local_a80;
  undefined4 local_a78;
  undefined4 local_a74;
  undefined4 local_a70;
  undefined4 local_a6c;
  undefined4 local_a68;
  undefined8 local_a60;
  long local_a58;
  int local_a4c;
  ulong local_a48;
  int local_a40;
  uint local_a3c;
  void *local_a38;
  int *local_a30;
  undefined8 local_a28;
  undefined4 local_a20;
  long *local_a18;
  undefined4 local_a10;
  uint local_a0c;
  undefined4 local_a08;
  undefined4 local_a04;
  undefined4 local_a00;
  long local_9f8;
  long local_9f0;
  long local_9e8;
  int local_9e0;
  void *local_9d0;
  int *local_9c8;
  undefined8 local_9c0;
  undefined4 local_9b8;
  long *local_9b0;
  undefined4 local_9a8;
  uint local_9a4;
  undefined4 local_9a0;
  undefined4 local_99c;
  undefined4 local_998;
  long local_990;
  long local_988;
  long local_980;
  long local_978;
  long local_970;
  long local_968;
  int local_95c;
  ulong local_958;
  int local_950;
  uint local_94c;
  int local_948;
  int local_944;
  long local_940;
  long local_938;
  int local_930;
  int local_92c;
  int local_928;
  int local_924 [3];
  ulong local_918;
  int local_90c;
  uint local_908;
  uint local_904;
  int local_900;
  int local_8fc;
  int local_8f8;
  int local_8f4;
  long local_8f0;
  float *local_8e8;
  long *local_8e0;
  float *local_8c8;
  float *local_8c0;
  float *local_8b8;
  undefined8 *local_8b0;
  undefined8 *local_8a8;
  long *local_8a0;
  undefined8 *local_898;
  undefined8 *local_890;
  char *local_888;
  char *local_880;
  undefined8 *local_878;
  float *local_870;
  int local_864;
  long *local_860;
  int local_854;
  long *local_850;
  int local_844;
  float *local_840;
  int local_834;
  float *local_830;
  int local_824;
  float *local_820;
  int local_814;
  float *local_810;
  int local_804;
  float *local_800;
  uint local_7f8;
  int local_7f4;
  long *local_7f0;
  void **local_7e8;
  uint local_7e0;
  int local_7dc;
  long *local_7d8;
  void **local_7d0;
  uint local_7c8;
  int local_7c4;
  long *local_7c0;
  void **local_7b8;
  uint local_7b0;
  int local_7ac;
  long *local_7a8;
  void **local_7a0;
  long *local_798;
  void **local_790;
  long *local_788;
  void **local_780;
  long *local_778;
  void **local_770;
  long *local_768;
  void **local_760;
  void **local_758;
  void **local_748;
  undefined8 *local_738;
  undefined8 *local_728;
  char *local_718;
  char *local_708;
  undefined8 *local_6f8;
  void **local_6e8;
  undefined8 *local_6d8;
  undefined8 *local_6c8;
  void **local_6b8;
  undefined1 local_6a5;
  int local_6a4;
  undefined8 *local_698;
  undefined1 local_685;
  int local_684;
  undefined8 *local_678;
  undefined1 local_665;
  int local_664;
  undefined8 *local_658;
  undefined1 local_645;
  int local_644;
  undefined8 *local_638;
  undefined1 local_625;
  int local_624;
  char *local_618;
  undefined1 local_605;
  int local_604;
  char *local_5f8;
  undefined1 local_5e5;
  int local_5e4;
  undefined8 *local_5d8;
  float *local_5c8;
  float *local_5c0;
  float *local_5b8;
  long *local_5b0;
  undefined4 local_5a4;
  undefined8 local_5a0;
  void *local_598;
  uint local_58c;
  void **local_588;
  long *local_580;
  undefined4 local_574;
  undefined8 local_570;
  void *local_568;
  uint local_55c;
  void **local_558;
  long *local_550;
  undefined4 local_544;
  undefined8 local_540;
  void *local_538;
  uint local_52c;
  void **local_528;
  long *local_520;
  undefined4 local_514;
  undefined8 local_510;
  void *local_508;
  uint local_4fc;
  void **local_4f8;
  int local_4f0;
  undefined4 local_4ec;
  void **local_4e8;
  int local_4e0;
  undefined4 local_4dc;
  void **local_4d8;
  int local_4d0;
  undefined4 local_4cc;
  void **local_4c8;
  int local_4c0;
  undefined4 local_4bc;
  void **local_4b8;
  int local_430;
  undefined4 local_42c;
  void **local_428;
  undefined8 *local_408;
  undefined8 *local_3e8;
  int local_3d0;
  undefined4 local_3cc;
  void **local_3c8;
  undefined8 *local_3a8;
  char *local_388;
  char *local_368;
  undefined8 *local_348;
  undefined8 *local_328;
  int local_310;
  undefined4 local_30c;
  void **local_308;
  int local_2f0;
  undefined4 local_2ec;
  void **local_2e8;
  void *local_2e0;
  void *local_2d0;
  void *local_270;
  void *local_240;
  undefined8 local_1f8;
  float local_1ec;
  long local_1e8;
  long local_1e0;
  float local_1d4;
  float local_1d0;
  float local_1cc;
  undefined8 *local_1c8;
  undefined8 local_1c0;
  float local_1b4;
  long local_1b0;
  long local_1a8;
  float local_19c;
  float local_198;
  float local_194;
  char *local_190;
  undefined8 local_188;
  float local_17c;
  long local_178;
  char *local_170;
  float local_164;
  float local_160;
  float local_15c;
  char *local_158;
  undefined8 local_150;
  float local_144;
  long local_140;
  long local_138;
  float local_12c;
  float local_128;
  float local_124;
  undefined8 *local_120;
  long local_118;
  float local_10c;
  long local_108;
  long local_100;
  float local_f4;
  float local_f0;
  float local_ec;
  undefined8 *local_e8;
  long local_e0;
  undefined4 local_d4;
  long local_d0;
  long local_c8;
  undefined4 local_bc;
  int local_b8;
  int local_b4;
  undefined8 *local_b0;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  long local_90;
  undefined4 local_84;
  int local_80;
  int local_7c;
  undefined8 *local_78;
  undefined4 local_6c;
  long local_68;
  undefined4 local_5c;
  long local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_8f4 = (int)in_RSI[5];
  local_8f8 = *(int *)((long)in_RSI + 0x2c);
  local_8fc = (int)in_RSI[6];
  local_900 = (int)in_RSI[7];
  local_904 = *(uint *)(in_RSI + 3);
  local_8f0 = in_RCX;
  local_8e8 = in_RDX;
  local_8e0 = in_RSI;
  if (local_8f4 == 1) {
    local_908 = 1;
    if (((*(byte *)(in_RCX + 0x27) & 1) != 0) &&
       (local_908 = 1, (int)(local_8f8 * local_904) % 8 == 0)) {
      local_908 = 8;
    }
    local_90c = (int)(local_8f8 * local_904) / (int)local_908;
    local_918 = (ulong)local_908;
    Mat::create(in_stack_fffffffffffff120,(int)((ulong)in_stack_fffffffffffff118 >> 0x20),
                in_stack_fffffffffffff110,(int)(in_stack_fffffffffffff108 >> 0x20),
                in_stack_fffffffffffff100);
    local_8b8 = local_8e8;
    bVar2 = true;
    if (*(long *)local_8e8 != 0) {
      local_5c8 = local_8e8;
      bVar2 = *(long *)(local_8e8 + 0x10) * (long)(int)local_8e8[0xe] == 0;
    }
    if (bVar2) {
      return -100;
    }
    local_924[1] = 1;
    local_924[0] = local_8f8 / *(int *)(local_8f0 + 4);
    piVar1 = std::max<int>(local_924 + 1,local_924);
    local_924[2] = *piVar1;
    local_928 = (local_8f8 + local_924[2] + -1) / local_924[2];
    for (local_92c = 0; local_92c < local_928; local_92c = local_92c + 1) {
      local_930 = local_92c * local_924[2];
      local_8a0 = local_8e0;
      local_938 = *local_8e0 + (long)(int)(local_930 * local_904) * 4;
      local_870 = local_8e8;
      local_940 = *(long *)local_8e8 + (long)(int)(local_930 * local_904);
      local_948 = local_8f8 - local_930;
      piVar1 = std::min<int>(&local_948,local_924 + 2);
      local_944 = *piVar1 * local_904;
      quantize(in_stack_fffffffffffff208,in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
               (int)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(int)in_stack_fffffffffffff1f0);
    }
  }
  if (local_8f4 == 2) {
    local_94c = 1;
    if (((*(byte *)(local_8f0 + 0x27) & 1) != 0) &&
       (local_94c = 1, (int)(local_8fc * local_904) % 8 == 0)) {
      local_94c = 8;
    }
    local_950 = (int)(local_8fc * local_904) / (int)local_94c;
    local_958 = (ulong)local_94c;
    Mat::create(in_stack_fffffffffffff120,(int)((ulong)in_stack_fffffffffffff118 >> 0x20),
                (int)in_stack_fffffffffffff118,in_stack_fffffffffffff110,
                (int)(in_stack_fffffffffffff108 >> 0x20),in_stack_fffffffffffff100);
    local_8c0 = local_8e8;
    bVar2 = true;
    if (*(long *)local_8e8 != 0) {
      local_5c0 = local_8e8;
      bVar2 = *(long *)(local_8e8 + 0x10) * (long)(int)local_8e8[0xe] == 0;
    }
    if (bVar2) {
      return -100;
    }
    if ((local_904 == 4) && (local_94c == 1)) {
      for (local_95c = 0; local_95c < local_8fc; local_95c = local_95c + 1) {
        local_850 = local_8e0;
        local_854 = local_95c;
        local_968 = *local_8e0 +
                    (long)*(int *)((long)local_8e0 + 0x2c) * (long)local_95c * local_8e0[2];
        local_804 = local_95c << 2;
        local_800 = local_8e8;
        local_970 = *(long *)local_8e8 +
                    (long)(int)local_8e8[0xb] * (long)local_804 * *(long *)(local_8e8 + 4);
        local_814 = local_95c * 4 + 1;
        local_810 = local_8e8;
        local_978 = *(long *)local_8e8 +
                    (long)(int)local_8e8[0xb] * (long)local_814 * *(long *)(local_8e8 + 4);
        local_824 = local_95c * 4 + 2;
        local_820 = local_8e8;
        local_980 = *(long *)local_8e8 +
                    (long)(int)local_8e8[0xb] * (long)local_824 * *(long *)(local_8e8 + 4);
        local_834 = local_95c * 4 + 3;
        local_830 = local_8e8;
        local_988 = *(long *)local_8e8 +
                    (long)(int)local_8e8[0xb] * (long)local_834 * *(long *)(local_8e8 + 4);
        if (*(int *)(in_RDI + 0xd0) < 2) {
          local_798 = (long *)(in_RDI + 0xd8);
          local_790 = &local_9d0;
          local_9d0 = (void *)*local_798;
          local_9c8 = *(int **)(in_RDI + 0xe0);
          local_9c0 = *(undefined8 *)(in_RDI + 0xe8);
          local_9b8 = *(undefined4 *)(in_RDI + 0xf0);
          local_9b0 = *(long **)(in_RDI + 0xf8);
          local_9a8 = *(undefined4 *)(in_RDI + 0x100);
          local_9a4 = *(uint *)(in_RDI + 0x104);
          local_9a0 = *(undefined4 *)(in_RDI + 0x108);
          local_99c = *(undefined4 *)(in_RDI + 0x10c);
          local_998 = *(undefined4 *)(in_RDI + 0x110);
          local_990 = *(long *)(in_RDI + 0x118);
          local_4b8 = local_790;
          if (local_9c8 != (int *)0x0) {
            local_4bc = 1;
            LOCK();
            local_4c0 = *local_9c8;
            *local_9c8 = *local_9c8 + 1;
            UNLOCK();
          }
        }
        else {
          local_7a8 = (long *)(in_RDI + 0xd8);
          local_7ac = local_95c * local_904;
          local_7a0 = &local_9d0;
          local_7b0 = local_904;
          local_598 = (void *)(*local_7a8 + (long)local_7ac * *(long *)(in_RDI + 0xe8));
          local_5a0 = *(undefined8 *)(in_RDI + 0xe8);
          local_5a4 = *(undefined4 *)(in_RDI + 0xf0);
          local_5b0 = *(long **)(in_RDI + 0xf8);
          local_588 = &local_9d0;
          local_58c = local_904;
          local_9c8 = (int *)0x0;
          local_9a8 = 1;
          local_9a4 = local_904;
          local_9a0 = 1;
          local_99c = 1;
          local_998 = 1;
          local_990 = (long)(int)local_904;
          local_9d0 = local_598;
          local_9c0 = local_5a0;
          local_9b8 = local_5a4;
          local_9b0 = local_5b0;
        }
        quantize_pack4to1(in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8,
                          in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8,
                          in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,
                          (int)scale_data_q_1.elemsize);
        local_758 = &local_9d0;
        local_2e8 = local_758;
        if (local_9c8 != (int *)0x0) {
          local_2ec = 0xffffffff;
          LOCK();
          local_2f0 = *local_9c8;
          *local_9c8 = *local_9c8 + -1;
          UNLOCK();
          if (local_2f0 == 1) {
            if (local_9b0 == (long *)0x0) {
              local_2e0 = local_9d0;
              if (local_9d0 != (void *)0x0) {
                free(local_9d0);
              }
            }
            else {
              (**(code **)(*local_9b0 + 0x18))(local_9b0,local_9d0);
            }
          }
        }
        local_9d0 = (void *)0x0;
        local_9c0 = 0;
        local_9b8 = 0;
        local_9a8 = 0;
        local_9a4 = 0;
        local_9a0 = 0;
        local_99c = 0;
        local_998 = 0;
        local_990 = 0;
        local_9c8 = (int *)0x0;
      }
    }
    if (local_904 == local_94c) {
      for (local_9e0 = 0; local_9e0 < local_8fc; local_9e0 = local_9e0 + 1) {
        local_860 = local_8e0;
        local_864 = local_9e0;
        local_9e8 = *local_8e0 +
                    (long)*(int *)((long)local_8e0 + 0x2c) * (long)local_9e0 * local_8e0[2];
        local_840 = local_8e8;
        local_844 = local_9e0;
        local_9f0 = *(long *)local_8e8 +
                    (long)(int)local_8e8[0xb] * (long)local_9e0 * *(long *)(local_8e8 + 4);
        if (*(int *)(in_RDI + 0xd0) < 2) {
          local_788 = (long *)(in_RDI + 0xd8);
          local_780 = &local_a38;
          local_a38 = (void *)*local_788;
          local_a30 = *(int **)(in_RDI + 0xe0);
          local_a28 = *(undefined8 *)(in_RDI + 0xe8);
          local_a20 = *(undefined4 *)(in_RDI + 0xf0);
          local_a18 = *(long **)(in_RDI + 0xf8);
          local_a10 = *(undefined4 *)(in_RDI + 0x100);
          local_a0c = *(uint *)(in_RDI + 0x104);
          local_a08 = *(undefined4 *)(in_RDI + 0x108);
          local_a04 = *(undefined4 *)(in_RDI + 0x10c);
          local_a00 = *(undefined4 *)(in_RDI + 0x110);
          local_9f8 = *(long *)(in_RDI + 0x118);
          local_4c8 = local_780;
          if (local_a30 != (int *)0x0) {
            local_4cc = 1;
            LOCK();
            local_4d0 = *local_a30;
            *local_a30 = *local_a30 + 1;
            UNLOCK();
          }
        }
        else {
          local_7c0 = (long *)(in_RDI + 0xd8);
          local_7c4 = local_9e0 * local_904;
          local_7b8 = &local_a38;
          local_7c8 = local_904;
          local_568 = (void *)(*local_7c0 + (long)local_7c4 * *(long *)(in_RDI + 0xe8));
          local_570 = *(undefined8 *)(in_RDI + 0xe8);
          local_574 = *(undefined4 *)(in_RDI + 0xf0);
          local_580 = *(long **)(in_RDI + 0xf8);
          local_558 = &local_a38;
          local_55c = local_904;
          local_a30 = (int *)0x0;
          local_a10 = 1;
          local_a0c = local_904;
          local_a08 = 1;
          local_a04 = 1;
          local_a00 = 1;
          local_9f8 = (long)(int)local_904;
          local_a38 = local_568;
          local_a28 = local_570;
          local_a20 = local_574;
          local_a18 = local_580;
        }
        quantize(in_stack_fffffffffffff208,in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                 (int)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(int)in_stack_fffffffffffff1f0);
        local_748 = &local_a38;
        local_308 = local_748;
        if (local_a30 != (int *)0x0) {
          local_30c = 0xffffffff;
          LOCK();
          local_310 = *local_a30;
          *local_a30 = *local_a30 + -1;
          UNLOCK();
          if (local_310 == 1) {
            if (local_a18 == (long *)0x0) {
              local_2d0 = local_a38;
              if (local_a38 != (void *)0x0) {
                free(local_a38);
              }
            }
            else {
              (**(code **)(*local_a18 + 0x18))(local_a18,local_a38);
            }
          }
        }
        local_a38 = (void *)0x0;
        local_a28 = 0;
        local_a20 = 0;
        local_a10 = 0;
        local_a0c = 0;
        local_a08 = 0;
        local_a04 = 0;
        local_a00 = 0;
        local_9f8 = 0;
        local_a30 = (int *)0x0;
      }
    }
  }
  if (local_8f4 == 3) {
    local_a3c = 1;
    if (((*(byte *)(local_8f0 + 0x27) & 1) != 0) &&
       (local_a3c = 1, (int)(local_900 * local_904) % 8 == 0)) {
      local_a3c = 8;
    }
    local_a40 = (int)(local_900 * local_904) / (int)local_a3c;
    local_a48 = (ulong)local_a3c;
    Mat::create(in_stack_fffffffffffff120,(int)((ulong)in_stack_fffffffffffff118 >> 0x20),
                (int)in_stack_fffffffffffff118,(int)(in_stack_fffffffffffff110 >> 0x20),
                in_stack_fffffffffffff108,(int)((ulong)in_stack_fffffffffffff100 >> 0x20),
                in_stack_fffffffffffff180);
    local_8c8 = local_8e8;
    bVar2 = true;
    if (*(long *)local_8e8 != 0) {
      local_5b8 = local_8e8;
      bVar2 = *(long *)(local_8e8 + 0x10) * (long)(int)local_8e8[0xe] == 0;
    }
    if (bVar2) {
      return -100;
    }
    if ((local_904 == 4) && (local_a3c == 1)) {
      for (local_a4c = 0; local_a4c < local_900; local_a4c = local_a4c + 1) {
        local_678 = &local_aa0;
        local_b4 = *(int *)((long)local_8e0 + 0x2c);
        local_b8 = (int)local_8e0[6];
        local_bc = *(undefined4 *)((long)local_8e0 + 0x34);
        local_a58 = *local_8e0 + local_8e0[8] * (long)local_a4c * local_8e0[2];
        local_d0 = local_8e0[2];
        local_d4 = (undefined4)local_8e0[3];
        local_e0 = local_8e0[4];
        local_b0 = &local_aa0;
        local_58 = (long)local_b4 * (long)local_b8 * local_d0;
        local_8a8 = &local_aa0;
        local_738 = &local_aa0;
        local_5e4 = local_a4c << 2;
        local_5d8 = &local_af0;
        local_1cc = local_8e8[0xb];
        local_1d0 = local_8e8[0xc];
        local_1d4 = local_8e8[0xd];
        local_aa8 = *(long *)local_8e8 +
                    *(long *)(local_8e8 + 0x10) * (long)local_5e4 * *(long *)(local_8e8 + 4);
        local_1e8 = *(long *)(local_8e8 + 4);
        local_1ec = local_8e8[6];
        local_1f8 = *(undefined8 *)(local_8e8 + 8);
        local_1c8 = &local_af0;
        local_8 = (long)(int)local_1cc * (long)(int)local_1d0 * local_1e8;
        local_878 = &local_af0;
        local_728 = &local_af0;
        local_604 = local_a4c * 4 + 1;
        local_5f8 = local_b40;
        local_194 = local_8e8[0xb];
        local_198 = local_8e8[0xc];
        local_19c = local_8e8[0xd];
        in_stack_fffffffffffff1f0 =
             *(long *)local_8e8 +
             *(long *)(local_8e8 + 0x10) * (long)local_604 * *(long *)(local_8e8 + 4);
        local_1b0 = *(long *)(local_8e8 + 4);
        local_1b4 = local_8e8[6];
        local_1c0 = *(undefined8 *)(local_8e8 + 8);
        in_stack_fffffffffffff200 = local_b40;
        local_18 = (long)(int)local_194 * (long)(int)local_198 * local_1b0;
        local_880 = local_b40;
        local_718 = local_b40;
        local_624 = local_a4c * 4 + 2;
        local_618 = local_b90;
        local_15c = local_8e8[0xb];
        local_160 = local_8e8[0xc];
        local_164 = local_8e8[0xd];
        local_b48 = (char *)(*(long *)local_8e8 +
                            *(long *)(local_8e8 + 0x10) * (long)local_624 * *(long *)(local_8e8 + 4)
                            );
        local_178 = *(long *)(local_8e8 + 4);
        local_17c = local_8e8[6];
        local_188 = *(undefined8 *)(local_8e8 + 8);
        local_158 = local_b90;
        local_28 = (long)(int)local_15c * (long)(int)local_160 * local_178;
        local_888 = local_b90;
        local_708 = local_b90;
        local_a68 = 0;
        local_a6c = 0;
        local_a70 = 0;
        local_a74 = 0;
        local_a88 = 0;
        local_a90 = 0;
        local_a98 = 0;
        local_aa0 = 0;
        local_ab8 = 0;
        local_abc = 0;
        local_ac0 = 0;
        local_ac4 = 0;
        local_ad8 = 0;
        local_ae0 = 0;
        local_ae8 = 0;
        local_af0 = 0;
        local_b08 = 0;
        local_b0c = 0;
        local_b10 = 0;
        local_b14 = 0;
        local_b40[0x18] = '\0';
        local_b40[0x19] = '\0';
        local_b40[0x1a] = '\0';
        local_b40[0x1b] = '\0';
        local_b40[0x10] = '\0';
        local_b40[0x11] = '\0';
        local_b40[0x12] = '\0';
        local_b40[0x13] = '\0';
        local_b40[0x14] = '\0';
        local_b40[0x15] = '\0';
        local_b40[0x16] = '\0';
        local_b40[0x17] = '\0';
        local_b40[8] = '\0';
        local_b40[9] = '\0';
        local_b40[10] = '\0';
        local_b40[0xb] = '\0';
        local_b40[0xc] = '\0';
        local_b40[0xd] = '\0';
        local_b40[0xe] = '\0';
        local_b40[0xf] = '\0';
        local_b40[0] = '\0';
        local_b40[1] = '\0';
        local_b40[2] = '\0';
        local_b40[3] = '\0';
        local_b40[4] = '\0';
        local_b40[5] = '\0';
        local_b40[6] = '\0';
        local_b40[7] = '\0';
        local_c = 0x10;
        local_1c = 0x10;
        local_2c = 0x10;
        local_5c = 0x10;
        local_5e5 = 1;
        local_605 = 1;
        local_625 = 1;
        local_684 = local_a4c;
        local_685 = 1;
        local_a60 = 0;
        local_a78 = 0;
        local_ab0 = 0;
        local_ac8 = 0;
        local_b00 = 0;
        local_b18 = 0;
        local_b90[0] = '\0';
        local_b90[1] = '\0';
        local_b90[2] = '\0';
        local_b90[3] = '\0';
        local_b90[4] = '\0';
        local_b90[5] = '\0';
        local_b90[6] = '\0';
        local_b90[7] = '\0';
        local_b90[0x10] = '\0';
        local_b90[0x11] = '\0';
        local_b90[0x12] = '\0';
        local_b90[0x13] = '\0';
        local_b90[0x14] = '\0';
        local_b90[0x15] = '\0';
        local_b90[0x16] = '\0';
        local_b90[0x17] = '\0';
        local_b90[0x18] = '\0';
        local_b90[0x19] = '\0';
        local_b90[0x1a] = '\0';
        local_b90[0x1b] = '\0';
        local_b68 = 0;
        local_b64 = 0;
        local_b60 = 0;
        local_b5c = 0;
        local_b58 = 0;
        local_b50 = 0;
        local_b90[8] = '\0';
        local_b90[9] = '\0';
        local_b90[10] = '\0';
        local_b90[0xb] = '\0';
        local_b90[0xc] = '\0';
        local_b90[0xd] = '\0';
        local_b90[0xe] = '\0';
        local_b90[0xf] = '\0';
        local_644 = local_a4c * 4 + 3;
        local_638 = &local_be0;
        local_124 = local_8e8[0xb];
        local_128 = local_8e8[0xc];
        local_12c = local_8e8[0xd];
        local_b98 = *(long *)local_8e8 +
                    *(long *)(local_8e8 + 0x10) * (long)local_644 * *(long *)(local_8e8 + 4);
        local_140 = *(long *)(local_8e8 + 4);
        local_144 = local_8e8[6];
        local_150 = *(undefined8 *)(local_8e8 + 8);
        local_120 = &local_be0;
        local_38 = (long)(int)local_124 * (long)(int)local_128 * local_140;
        local_890 = &local_be0;
        local_6f8 = &local_be0;
        local_3c = 0x10;
        local_645 = 1;
        local_be0 = 0;
        local_bd0 = 0;
        local_bc8 = 0;
        local_bb8 = 0;
        local_bb4 = 0;
        local_bb0 = 0;
        local_bac = 0;
        local_ba8 = 0;
        local_ba0 = 0;
        local_bd8 = 0;
        if (*(int *)(in_RDI + 0xd0) < 2) {
          local_778 = (long *)(in_RDI + 0xd8);
          local_770 = &local_c28;
          local_c28 = (void *)*local_778;
          local_c20 = *(int **)(in_RDI + 0xe0);
          local_c18 = *(undefined8 *)(in_RDI + 0xe8);
          local_c10 = *(undefined4 *)(in_RDI + 0xf0);
          local_c08 = *(long **)(in_RDI + 0xf8);
          local_c00 = *(undefined4 *)(in_RDI + 0x100);
          local_bfc = *(uint *)(in_RDI + 0x104);
          local_bf8 = *(undefined4 *)(in_RDI + 0x108);
          local_bf4 = *(undefined4 *)(in_RDI + 0x10c);
          local_bf0 = *(undefined4 *)(in_RDI + 0x110);
          local_be8 = *(long *)(in_RDI + 0x118);
          local_4d8 = local_770;
          if (local_c20 != (int *)0x0) {
            local_4dc = 1;
            LOCK();
            local_4e0 = *local_c20;
            *local_c20 = *local_c20 + 1;
            UNLOCK();
          }
        }
        else {
          local_7d8 = (long *)(in_RDI + 0xd8);
          local_7dc = local_a4c * local_904;
          local_7d0 = &local_c28;
          local_7e0 = local_904;
          local_538 = (void *)(*local_7d8 + (long)local_7dc * *(long *)(in_RDI + 0xe8));
          local_540 = *(undefined8 *)(in_RDI + 0xe8);
          local_544 = *(undefined4 *)(in_RDI + 0xf0);
          local_550 = *(long **)(in_RDI + 0xf8);
          local_528 = &local_c28;
          local_52c = local_904;
          local_c20 = (int *)0x0;
          local_c00 = 1;
          local_bfc = local_904;
          local_bf8 = 1;
          local_bf4 = 1;
          local_bf0 = 1;
          local_be8 = (long)(int)local_904;
          local_c28 = local_538;
          local_c18 = local_540;
          local_c10 = local_544;
          local_c08 = local_550;
        }
        in_stack_fffffffffffff208 = local_8e8;
        local_af8 = in_stack_fffffffffffff1f0;
        local_3a8 = local_6f8;
        local_388 = local_708;
        local_368 = local_718;
        local_348 = local_728;
        local_328 = local_738;
        local_1e0 = local_aa8;
        local_1a8 = in_stack_fffffffffffff1f0;
        local_190 = in_stack_fffffffffffff200;
        local_170 = local_b48;
        local_138 = local_b98;
        local_c8 = local_a58;
        local_bc0 = local_150;
        local_b70 = local_188;
        local_b20 = local_1c0;
        local_ad0 = local_1f8;
        local_a80 = local_e0;
        quantize_pack4to1(local_8e8,local_158,in_stack_fffffffffffff1d0,local_b48,local_708,
                          (Mat *)local_8e8,(int)scale_data_q_1.elemsize);
        local_6e8 = &local_c28;
        local_3c8 = local_6e8;
        if (local_c20 != (int *)0x0) {
          local_3cc = 0xffffffff;
          LOCK();
          local_3d0 = *local_c20;
          *local_c20 = *local_c20 + -1;
          UNLOCK();
          if (local_3d0 == 1) {
            if (local_c08 == (long *)0x0) {
              local_270 = local_c28;
              if (local_c28 != (void *)0x0) {
                free(local_c28);
              }
            }
            else {
              (**(code **)(*local_c08 + 0x18))(local_c08,local_c28);
            }
          }
        }
        local_c28 = (void *)0x0;
        local_c18 = 0;
        local_c10 = 0;
        local_c00 = 0;
        local_bfc = 0;
        local_bf8 = 0;
        local_bf4 = 0;
        local_bf0 = 0;
        local_be8 = 0;
        local_c20 = (int *)0x0;
      }
    }
    if (local_904 == local_a3c) {
      for (local_c2c = 0; local_c2c < local_900; local_c2c = local_c2c + 1) {
        local_698 = &local_c80;
        local_7c = *(int *)((long)local_8e0 + 0x2c);
        local_80 = (int)local_8e0[6];
        local_84 = *(undefined4 *)((long)local_8e0 + 0x34);
        local_c38 = *local_8e0 + local_8e0[8] * (long)local_c2c * local_8e0[2];
        local_98 = local_8e0[2];
        local_9c = (undefined4)local_8e0[3];
        local_a8 = local_8e0[4];
        local_78 = &local_c80;
        local_68 = (long)local_7c * (long)local_80 * local_98;
        local_8b0 = &local_c80;
        local_6d8 = &local_c80;
        local_658 = &local_cd0;
        local_ec = local_8e8[0xb];
        local_f0 = local_8e8[0xc];
        local_f4 = local_8e8[0xd];
        local_c88 = *(long *)local_8e8 +
                    *(long *)(local_8e8 + 0x10) * (long)local_c2c * *(long *)(local_8e8 + 4);
        local_108 = *(long *)(local_8e8 + 4);
        local_10c = local_8e8[6];
        local_118 = *(long *)(local_8e8 + 8);
        local_e8 = &local_cd0;
        local_48 = (long)(int)local_ec * (long)(int)local_f0 * local_108;
        local_898 = &local_cd0;
        local_6c8 = &local_cd0;
        local_c48 = 0;
        local_c4c = 0;
        local_c50 = 0;
        local_c54 = 0;
        local_c68 = 0;
        local_c70 = 0;
        local_c78 = 0;
        local_c80 = 0;
        local_4c = 0x10;
        local_6c = 0x10;
        local_664 = local_c2c;
        local_665 = 1;
        local_6a4 = local_c2c;
        local_6a5 = 1;
        local_c40 = 0;
        local_c58 = 0;
        local_cd0 = 0;
        local_cc0 = 0;
        local_cb8 = 0;
        local_ca8 = 0;
        local_ca4 = 0;
        local_ca0 = 0;
        local_c9c = 0;
        local_c98 = 0;
        local_c90 = 0;
        local_cc8 = 0;
        if (*(int *)(in_RDI + 0xd0) < 2) {
          local_768 = (long *)(in_RDI + 0xd8);
          local_760 = &local_d18;
          local_d18 = (void *)*local_768;
          local_d10 = *(int **)(in_RDI + 0xe0);
          local_d08 = *(undefined8 *)(in_RDI + 0xe8);
          local_d00 = *(undefined4 *)(in_RDI + 0xf0);
          local_cf8 = *(long **)(in_RDI + 0xf8);
          local_cf0 = *(undefined4 *)(in_RDI + 0x100);
          local_cec = *(uint *)(in_RDI + 0x104);
          local_ce8 = *(undefined4 *)(in_RDI + 0x108);
          local_ce4 = *(undefined4 *)(in_RDI + 0x10c);
          local_ce0 = *(undefined4 *)(in_RDI + 0x110);
          local_cd8 = *(long *)(in_RDI + 0x118);
          local_4e8 = local_760;
          if (local_d10 != (int *)0x0) {
            local_4ec = 1;
            LOCK();
            local_4f0 = *local_d10;
            *local_d10 = *local_d10 + 1;
            UNLOCK();
          }
        }
        else {
          local_7f0 = (long *)(in_RDI + 0xd8);
          local_7f4 = local_c2c * local_904;
          local_7e8 = &local_d18;
          local_7f8 = local_904;
          local_508 = (void *)(*local_7f0 + (long)local_7f4 * *(long *)(in_RDI + 0xe8));
          local_510 = *(undefined8 *)(in_RDI + 0xe8);
          local_514 = *(undefined4 *)(in_RDI + 0xf0);
          local_520 = *(long **)(in_RDI + 0xf8);
          local_4f8 = &local_d18;
          local_4fc = local_904;
          local_d10 = (int *)0x0;
          local_cf0 = 1;
          local_cec = local_904;
          local_ce8 = 1;
          local_ce4 = 1;
          local_ce0 = 1;
          local_cd8 = (long)(int)local_904;
          local_d18 = local_508;
          local_d08 = local_510;
          local_d00 = local_514;
          local_cf8 = local_520;
        }
        local_408 = local_6c8;
        local_3e8 = local_6d8;
        local_100 = local_c88;
        local_90 = local_c38;
        local_cb0 = local_118;
        local_c60 = local_a8;
        quantize(in_stack_fffffffffffff208,in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                 (int)((ulong)in_stack_fffffffffffff1f0 >> 0x20),(int)in_stack_fffffffffffff1f0);
        ppvVar3 = &local_d18;
        local_6b8 = ppvVar3;
        local_428 = ppvVar3;
        if (local_d10 != (int *)0x0) {
          local_42c = 0xffffffff;
          LOCK();
          local_430 = *local_d10;
          *local_d10 = *local_d10 + -1;
          UNLOCK();
          if (local_430 == 1) {
            if (local_cf8 == (long *)0x0) {
              local_240 = local_d18;
              if (local_d18 != (void *)0x0) {
                free(local_d18);
              }
            }
            else {
              (**(code **)(*local_cf8 + 0x18))(local_cf8,local_d18);
            }
          }
        }
        *ppvVar3 = (void *)0x0;
        ppvVar3[2] = (void *)0x0;
        *(undefined4 *)(ppvVar3 + 3) = 0;
        *(undefined4 *)(ppvVar3 + 5) = 0;
        *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
        *(undefined4 *)(ppvVar3 + 6) = 0;
        *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
        *(undefined4 *)(ppvVar3 + 7) = 0;
        ppvVar3[8] = (void *)0x0;
        ppvVar3[1] = (void *)0x0;
      }
    }
  }
  return 0;
}

Assistant:

int Quantize_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int dims = bottom_blob.dims;
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int channels = bottom_blob.c;
    const int elempack = bottom_blob.elempack;

    if (dims == 1)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = w * elempack % 8 == 0 ? 8 : 1;
        }
#endif
        const int outw = w * elempack / out_elempack;
        const size_t out_elemsize = out_elempack * 1u;

        top_blob.create(outw, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int wp = std::max(1, w / opt.num_threads);
        const int nn_w = (w + wp - 1) / wp;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_w; ii++)
        {
            const int i = ii * wp;

            const float* ptr = (const float*)bottom_blob + i * elempack;
            signed char* s8ptr = (signed char*)top_blob + i * elempack;

            // assert scale_data_size == 1

            const int size = std::min(w - i, wp) * elempack;

            quantize(ptr, s8ptr, scale_data, size, 1);
        }
    }

    if (dims == 2)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = h * elempack % 8 == 0 ? 8 : 1;
        }
#endif
        const int outh = h * elempack / out_elempack;
        const size_t out_elemsize = out_elempack * 1u;

        top_blob.create(w, outh, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                signed char* s8ptr0 = top_blob.row<signed char>(i * 2);
                signed char* s8ptr1 = top_blob.row<signed char>(i * 2 + 1);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;

                quantize_pack16to8(ptr, s8ptr0, s8ptr1, scale_data_i, w);
            }
        }
#endif // __AVX512F__
#if !__AVX__
        if (elempack == 4 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const float* ptr0 = bottom_blob.row(i * 2);
                const float* ptr1 = bottom_blob.row(i * 2 + 1);
                signed char* s8ptr = top_blob.row<signed char>(i);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * out_elempack, out_elempack) : scale_data;

                quantize_pack4to8(ptr0, ptr1, s8ptr, scale_data_i, w);
            }
        }
#endif // !__AVX__
        if (elempack == 4 && out_elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                signed char* s8ptr0 = top_blob.row<signed char>(i * 4);
                signed char* s8ptr1 = top_blob.row<signed char>(i * 4 + 1);
                signed char* s8ptr2 = top_blob.row<signed char>(i * 4 + 2);
                signed char* s8ptr3 = top_blob.row<signed char>(i * 4 + 3);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;

                quantize_pack4to1(ptr, s8ptr0, s8ptr1, s8ptr2, s8ptr3, scale_data_i, w);
            }
        }
#endif // __SSE2__
        if (elempack == out_elempack)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                signed char* s8ptr = top_blob.row<signed char>(i);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;

                quantize(ptr, s8ptr, scale_data_i, w, elempack);
            }
        }
    }

    if (dims == 3)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = channels * elempack % 8 == 0 ? 8 : 1;
        }
#endif
        const int outc = channels * elempack / out_elempack;
        const size_t out_elemsize = out_elempack * 1u;

        top_blob.create(w, h, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                signed char* s8ptr0 = top_blob.channel(q * 2);
                signed char* s8ptr1 = top_blob.channel(q * 2 + 1);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;

                quantize_pack16to8(ptr, s8ptr0, s8ptr1, scale_data_q, w * h);
            }
        }
#endif // __AVX512F__
#if !__AVX__
        if (elempack == 4 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                const float* ptr0 = bottom_blob.channel(q * 2);
                const float* ptr1 = bottom_blob.channel(q * 2 + 1);
                signed char* s8ptr = top_blob.channel(q);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * out_elempack, out_elempack) : scale_data;

                quantize_pack4to8(ptr0, ptr1, s8ptr, scale_data_q, w * h);
            }
        }
#endif // !__AVX__
        if (elempack == 4 && out_elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                signed char* s8ptr0 = top_blob.channel(q * 4);
                signed char* s8ptr1 = top_blob.channel(q * 4 + 1);
                signed char* s8ptr2 = top_blob.channel(q * 4 + 2);
                signed char* s8ptr3 = top_blob.channel(q * 4 + 3);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;

                quantize_pack4to1(ptr, s8ptr0, s8ptr1, s8ptr2, s8ptr3, scale_data_q, w * h);
            }
        }
#endif // __SSE2__
        if (elempack == out_elempack)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                signed char* s8ptr = top_blob.channel(q);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;

                quantize(ptr, s8ptr, scale_data_q, w * h, elempack);
            }
        }
    }

    return 0;
}